

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

sunrealtype N_VMaxNorm_Serial(N_Vector x)

{
  long lVar1;
  long lVar2;
  sunrealtype sVar3;
  double dVar4;
  
  lVar1 = *x->content;
  lVar2 = 0;
  if (lVar1 < 1) {
    lVar1 = lVar2;
  }
  sVar3 = 0.0;
  for (; lVar1 != lVar2; lVar2 = lVar2 + 1) {
    dVar4 = ABS(*(double *)(*(long *)((long)x->content + 0x10) + lVar2 * 8));
    if (dVar4 <= sVar3) {
      dVar4 = sVar3;
    }
    sVar3 = dVar4;
  }
  return sVar3;
}

Assistant:

sunrealtype N_VMaxNorm_Serial(N_Vector x)
{
  sunindextype i, N;
  sunrealtype max, *xd;

  max = ZERO;
  xd  = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);

  for (i = 0; i < N; i++)
  {
    if (SUNRabs(xd[i]) > max) { max = SUNRabs(xd[i]); }
  }

  return (max);
}